

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map_checked.hh
# Opt level: O1

Roaring64Map *
doublechecked::Roaring64Map::fastunion
          (Roaring64Map *__return_storage_ptr__,size_t n,Roaring64Map **inputs)

{
  Roaring64Map *other;
  bool bVar1;
  Roaring64Map **inputs_00;
  uint64_t uVar2;
  size_t sVar3;
  Roaring64Map temp;
  undefined1 local_98 [104];
  
  inputs_00 = (Roaring64Map **)operator_new__(-(ulong)(n >> 0x3d != 0) | n * 8);
  if (n != 0) {
    memcpy(inputs_00,inputs,n * 8);
  }
  roaring::Roaring64Map::fastunion((Roaring64Map *)local_98,n,inputs_00);
  Roaring64Map(__return_storage_ptr__,(Roaring64Map *)local_98);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
               *)local_98);
  operator_delete__(inputs_00);
  if (n == 0) {
    uVar2 = roaring::Roaring64Map::cardinality(&__return_storage_ptr__->plain);
    _assert_true((ulong)(uVar2 == (__return_storage_ptr__->check)._M_t._M_impl.super__Rb_tree_header
                                  ._M_node_count),"ans == check.size()",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64map_checked.hh"
                 ,0x156);
    _assert_true((ulong)(uVar2 == 0),"ans.cardinality() == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64map_checked.hh"
                 ,0x1fe);
  }
  else {
    Roaring64Map((Roaring64Map *)local_98,*inputs);
    if (n != 1) {
      sVar3 = 1;
      do {
        other = inputs[sVar3];
        roaring::Roaring64Map::operator|=((Roaring64Map *)local_98,&other->plain);
        std::
        _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
        ::_M_insert_range_unique<std::_Rb_tree_const_iterator<unsigned_long>>
                  ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                    *)(local_98 + 0x38),
                   (other->check)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                   (_Rb_tree_const_iterator<unsigned_long>)
                   &(other->check)._M_t._M_impl.super__Rb_tree_header);
        sVar3 = sVar3 + 1;
      } while (n != sVar3);
    }
    bVar1 = operator==((Roaring64Map *)local_98,__return_storage_ptr__);
    _assert_true((ulong)bVar1,"temp == ans",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64map_checked.hh"
                 ,0x202);
    ~Roaring64Map((Roaring64Map *)local_98);
  }
  return __return_storage_ptr__;
}

Assistant:

static Roaring64Map fastunion(size_t n, const Roaring64Map **inputs) {
        auto plain_inputs = new const roaring::Roaring64Map *[n];
        for (size_t i = 0; i < n; ++i) plain_inputs[i] = &inputs[i]->plain;
        Roaring64Map ans(roaring::Roaring64Map::fastunion(n, plain_inputs));
        delete[] plain_inputs;

        if (n == 0)
            assert_true(ans.cardinality() == 0);
        else {
            Roaring64Map temp = *inputs[0];
            for (size_t i = 1; i < n; ++i) temp |= *inputs[i];
            assert_true(temp == ans);
        }

        return ans;
    }